

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O3

void __thiscall
icu_63::RegexCompile::compile(RegexCompile *this,UText *pat,UParseError *pp,UErrorCode *e)

{
  RegexPatternChar *c;
  int8_t *piVar1;
  int iVar2;
  RegexPattern *pRVar3;
  UnicodeSet **ppUVar4;
  char cVar5;
  UBool UVar6;
  int iVar7;
  int32_t iVar8;
  UText *pUVar9;
  int64_t iVar10;
  UnicodeSet *pUVar11;
  Regex8BitSet *pRVar12;
  byte bVar13;
  int32_t i;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  RegexPatternChar *p;
  size_t size;
  UMemory *this_00;
  long lVar17;
  long lVar18;
  bool bVar19;
  
  this->fStatus = e;
  this->fParseErr = pp;
  this->fStackPtr = 0;
  this->fStack[0] = 0;
  if (U_ZERO_ERROR < *e) {
    return;
  }
  pUVar9 = utext_clone_63(this->fRXPat->fPattern,pat,'\0','\x01',e);
  pRVar3 = this->fRXPat;
  pRVar3->fPattern = pUVar9;
  ppUVar4 = RegexStaticSets::gStaticSets;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar3->fStaticSets = RegexStaticSets::gStaticSets;
    pRVar3->fStaticSets8 = (Regex8BitSet *)(ppUVar4 + 0xd);
    iVar10 = utext_nativeLength_63(pat);
    this->fPatternLength = iVar10;
    if ((this->fModeFlags & 0x10) != 0) {
      this->fQuoteMode = '\x01';
    }
    c = &this->fC;
    p = c;
    nextChar(this,c);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar15 = 1;
      do {
        puVar16 = (uint *)(gRuleParseStateTable + uVar15 * 8);
        bVar13 = gRuleParseStateTable[uVar15 * 8 + 4];
        cVar5 = (this->fC).fQuoted;
        bVar19 = cVar5 == '\0';
        uVar14 = (this->fC).fChar;
        if ((0x7e < bVar13 || !bVar19) || uVar14 != bVar13) {
          do {
            if (bVar13 == 0xfe) {
              if (!bVar19) break;
            }
            else {
              if ((bVar13 == 0xff) || (bVar13 == 0xfd && uVar14 == 0xffffffff)) break;
              if ((!(bool)(~bVar19 & 1) && (char)bVar13 < -0x10) && uVar14 != 0xffffffff) {
                UVar6 = UnicodeSet::contains
                                  ((UnicodeSet *)
                                   (RegexStaticSets::gStaticSets +
                                   (ulong)(bVar13 & 0x7f) * 0xb + 0x41),uVar14);
                if (UVar6 != '\0') break;
                cVar5 = (this->fC).fQuoted;
                uVar14 = (this->fC).fChar;
              }
            }
            bVar13 = (byte)puVar16[3];
            puVar16 = puVar16 + 2;
            bVar19 = cVar5 == '\0';
          } while ((0x7e < bVar13 || !bVar19) || uVar14 != bVar13);
        }
        p = (RegexPatternChar *)(ulong)*puVar16;
        UVar6 = doParseActions(this,*puVar16);
        if (UVar6 == '\0') {
          if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            allocateStackData(this,2);
            stripNOPs(this);
            size = 3;
            iVar8 = minMatchLength(this,3,this->fRXPat->fCompiledPat->count + -1);
            this->fRXPat->fMinMatchLen = iVar8;
            matchStartType(this);
            iVar7 = this->fRXPat->fSets->count;
            lVar17 = (long)iVar7;
            this_00 = (UMemory *)0xffffffffffffffff;
            if (-1 < lVar17) {
              this_00 = (UMemory *)(lVar17 << 5);
            }
            pRVar12 = (Regex8BitSet *)UMemory::operator_new__(this_00,size);
            if (pRVar12 == (Regex8BitSet *)0x0) {
              this->fRXPat->fSets8 = (Regex8BitSet *)0x0;
              *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
              *e = U_MEMORY_ALLOCATION_ERROR;
              return;
            }
            if (iVar7 == 0) {
              this->fRXPat->fSets8 = pRVar12;
              return;
            }
            memset(pRVar12,0,(size_t)(lVar17 << 5));
            this->fRXPat->fSets8 = pRVar12;
            if (iVar7 < 1) {
              return;
            }
            lVar18 = 0;
            do {
              pUVar11 = (UnicodeSet *)UVector::elementAt(this->fRXPat->fSets,(int32_t)lVar18);
              if (pUVar11 != (UnicodeSet *)0x0) {
                pRVar12 = this->fRXPat->fSets8;
                uVar15 = 0;
                do {
                  UVar6 = UnicodeSet::contains(pUVar11,(int)uVar15);
                  if (UVar6 != '\0') {
                    piVar1 = pRVar12[lVar18].d + (uVar15 >> 3);
                    *piVar1 = *piVar1 | (byte)(1 << ((byte)uVar15 & 7));
                  }
                  uVar14 = (int)uVar15 + 1;
                  uVar15 = (ulong)uVar14;
                } while (uVar14 != 0x100);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != lVar17);
            return;
          }
          break;
        }
        bVar13 = *(byte *)((long)puVar16 + 6);
        if (bVar13 != 0) {
          iVar2 = this->fStackPtr;
          iVar7 = iVar2 + 1;
          this->fStackPtr = iVar7;
          if (0x62 < iVar2) {
            p = (RegexPatternChar *)0x10300;
            error(this,U_REGEX_ERROR_START);
            iVar7 = this->fStackPtr + -1;
            this->fStackPtr = iVar7;
          }
          this->fStack[iVar7] = (ushort)bVar13;
        }
        if (*(char *)((long)puVar16 + 7) != '\0') {
          p = c;
          nextChar(this,c);
        }
        uVar15 = (ulong)*(byte *)((long)puVar16 + 5);
        if (*(byte *)((long)puVar16 + 5) == 0xff) {
          iVar7 = this->fStackPtr;
          uVar15 = (ulong)this->fStack[iVar7];
          this->fStackPtr = iVar7 + -1;
          if ((long)iVar7 < 1) {
            this->fStackPtr = iVar7;
            p = (RegexPatternChar *)0x10306;
            error(this,U_REGEX_MISMATCHED_PAREN);
          }
        }
      } while (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR);
    }
    if ((this->fSetStack).super_UVector.count != 0) {
      do {
        pUVar11 = (UnicodeSet *)UStack::pop(&this->fSetStack);
        if (pUVar11 != (UnicodeSet *)0x0) {
          UnicodeSet::~UnicodeSet(pUVar11);
        }
        UMemory::operator_delete((UMemory *)pUVar11,p);
      } while ((this->fSetStack).super_UVector.count != 0);
    }
  }
  return;
}

Assistant:

void    RegexCompile::compile(
                         UText *pat,                 // Source pat to be compiled.
                         UParseError &pp,            // Error position info
                         UErrorCode &e)              // Error Code
{
    fStatus             = &e;
    fParseErr           = &pp;
    fStackPtr           = 0;
    fStack[fStackPtr]   = 0;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // There should be no pattern stuff in the RegexPattern object.  They can not be reused.
    U_ASSERT(fRXPat->fPattern == NULL || utext_nativeLength(fRXPat->fPattern) == 0);

    // Prepare the RegexPattern object to receive the compiled pattern.
    fRXPat->fPattern        = utext_clone(fRXPat->fPattern, pat, FALSE, TRUE, fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    fRXPat->fStaticSets     = RegexStaticSets::gStaticSets->fPropSets;
    fRXPat->fStaticSets8    = RegexStaticSets::gStaticSets->fPropSets8;


    // Initialize the pattern scanning state machine
    fPatternLength = utext_nativeLength(pat);
    uint16_t                state = 1;
    const RegexTableEl      *tableEl;

    // UREGEX_LITERAL force entire pattern to be treated as a literal string.
    if (fModeFlags & UREGEX_LITERAL) {
        fQuoteMode = TRUE;
    }

    nextChar(fC);                        // Fetch the first char from the pattern string.

    //
    // Main loop for the regex pattern parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next pattern char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //   file regexcst.txt is the source for the state table.  The logic behind
    //     recongizing the pattern syntax is there, not here.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  Regex pattern parsing stops on the first error encountered.
        if (U_FAILURE(*fStatus)) {
            break;
        }

        U_ASSERT(state != 0);

        // Find the state table element that matches the input char from the pattern, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        REGEX_SCAN_DEBUG_PRINTF(("char, line, col = (\'%c\', %d, %d)    state=%s ",
            fC.fChar, fLineNum, fCharNum, RegexStateNames[state]));

        for (;;) {    // loop through table rows belonging to this state, looking for one
                      //   that matches the current input char.
            REGEX_SCAN_DEBUG_PRINTF(("."));
            if (tableEl->fCharClass < 127 && fC.fQuoted == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not quoted, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fQuoted)  {
                // Table row specified "quoted" and the char was quoted.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fQuoted == FALSE &&                                       //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT(tableEl->fCharClass <= 137);
                if (RegexStaticSets::gStaticSets->fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        REGEX_SCAN_DEBUG_PRINTF(("\n"));

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions(tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_REGEX_INTERNAL_ERROR);
                REGEX_SCAN_DEBUG_PRINTF(("RegexCompile::parse() - state stack overflow.\n"));
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        //
        //  NextChar.  This is where characters are actually fetched from the pattern.
        //             Happens under control of the 'n' tag in the state table.
        //
        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                // state stack underflow
                // This will occur if the user pattern has mis-matched parentheses,
                //   with extra close parens.
                //
                fStackPtr++;
                error(U_REGEX_MISMATCHED_PAREN);
            }
        }

    }

    if (U_FAILURE(*fStatus)) {
        // Bail out if the pattern had errors.
        //   Set stack cleanup:  a successful compile would have left it empty,
        //   but errors can leave temporary sets hanging around.
        while (!fSetStack.empty()) {
            delete (UnicodeSet *)fSetStack.pop();
        }
        return;
    }

    //
    // The pattern has now been read and processed, and the compiled code generated.
    //

    //
    // The pattern's fFrameSize so far has accumulated the requirements for
    //   storage for capture parentheses, counters, etc. that are encountered
    //   in the pattern.  Add space for the two variables that are always
    //   present in the saved state:  the input string position (int64_t) and
    //   the position in the compiled pattern.
    //
    allocateStackData(RESTACKFRAME_HDRCOUNT);

    //
    // Optimization pass 1: NOPs, back-references, and case-folding
    //
    stripNOPs();

    //
    // Get bounds for the minimum and maximum length of a string that this
    //   pattern can match.  Used to avoid looking for matches in strings that
    //   are too short.
    //
    fRXPat->fMinMatchLen = minMatchLength(3, fRXPat->fCompiledPat->size()-1);

    //
    // Optimization pass 2: match start type
    //
    matchStartType();

    //
    // Set up fast latin-1 range sets
    //
    int32_t numSets = fRXPat->fSets->size();
    fRXPat->fSets8 = new Regex8BitSet[numSets];
    // Null pointer check.
    if (fRXPat->fSets8 == NULL) {
        e = *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    int32_t i;
    for (i=0; i<numSets; i++) {
        UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(i);
        fRXPat->fSets8[i].init(s);
    }

}